

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearCase.cpp
# Opt level: O0

void __thiscall deqp::egl::ColorClearThread::run(ColorClearThread *this)

{
  EGLint api;
  ApiFunctions *func;
  bool bVar1;
  pointer pCVar2;
  Semaphore *pSVar3;
  int local_24;
  const_iterator cStack_20;
  int ndx;
  __normal_iterator<const_deqp::egl::ClearPacket_*,_std::vector<deqp::egl::ClearPacket,_std::allocator<deqp::egl::ClearPacket>_>_>
  local_18;
  const_iterator packetIter;
  ColorClearThread *this_local;
  
  packetIter._M_current = (ClearPacket *)this;
  local_18._M_current =
       (ClearPacket *)
       std::vector<deqp::egl::ClearPacket,_std::allocator<deqp::egl::ClearPacket>_>::begin
                 (this->m_packets);
  while( true ) {
    cStack_20 = std::vector<deqp::egl::ClearPacket,_std::allocator<deqp::egl::ClearPacket>_>::end
                          (this->m_packets);
    bVar1 = __gnu_cxx::operator!=(&local_18,&stack0xffffffffffffffe0);
    if (!bVar1) break;
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_deqp::egl::ClearPacket_*,_std::vector<deqp::egl::ClearPacket,_std::allocator<deqp::egl::ClearPacket>_>_>
             ::operator->(&local_18);
    pSVar3 = de::SharedPtr<de::Semaphore>::operator->(&pCVar2->wait);
    de::Semaphore::decrement(pSVar3);
    (*this->m_egl->_vptr_Library[0x27])
              (this->m_egl,this->m_display,this->m_surface,this->m_surface,this->m_context);
    for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
      api = this->m_api;
      func = this->m_funcs;
      pCVar2 = __gnu_cxx::
               __normal_iterator<const_deqp::egl::ClearPacket_*,_std::vector<deqp::egl::ClearPacket,_std::allocator<deqp::egl::ClearPacket>_>_>
               ::operator->(&local_18);
      renderClear(api,func,pCVar2->clears + local_24);
    }
    finish(this->m_api,this->m_funcs);
    (*this->m_egl->_vptr_Library[0x27])(this->m_egl,this->m_display,0,0);
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_deqp::egl::ClearPacket_*,_std::vector<deqp::egl::ClearPacket,_std::allocator<deqp::egl::ClearPacket>_>_>
             ::operator->(&local_18);
    pSVar3 = de::SharedPtr<de::Semaphore>::operator->(&pCVar2->signal);
    de::Semaphore::increment(pSVar3);
    __gnu_cxx::
    __normal_iterator<const_deqp::egl::ClearPacket_*,_std::vector<deqp::egl::ClearPacket,_std::allocator<deqp::egl::ClearPacket>_>_>
    ::operator++(&local_18,0);
  }
  return;
}

Assistant:

void run (void)
	{
		for (std::vector<ClearPacket>::const_iterator packetIter = m_packets.begin(); packetIter != m_packets.end(); packetIter++)
		{
			// Wait until it is our turn.
			packetIter->wait->decrement();

			// Acquire context.
			m_egl.makeCurrent(m_display, m_surface, m_surface, m_context);

			// Execute clears.
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(packetIter->clears); ndx++)
				renderClear(m_api, m_funcs, packetIter->clears[ndx]);

			finish(m_api, m_funcs);
			// Release context.
			m_egl.makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);

			// Signal completion.
			packetIter->signal->increment();
		}
	}